

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O3

uint64_t compute_scratch_buffer_size(exr_decode_pipeline_t *decode,uint64_t uncompressed_size)

{
  uint uVar1;
  exr_coding_channel_info_t *peVar2;
  ulong uVar3;
  uint64_t ret;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if ((long)decode->channel_count < 1) {
    uVar3 = 0;
  }
  else {
    peVar2 = decode->channels;
    lVar4 = 0;
    uVar3 = 0;
    do {
      uVar1 = *(uint *)((long)&peVar2->height + lVar4);
      uVar5 = *(uint *)((long)&peVar2->width + lVar4);
      uVar6 = uVar5 + 3;
      if (-1 < (int)uVar5) {
        uVar6 = uVar5;
      }
      uVar7 = (uVar6 & 0xfffffffc) + 4;
      if (uVar5 == (uVar6 & 0xfffffffc)) {
        uVar7 = uVar5;
      }
      uVar5 = uVar1 + 3;
      if (-1 < (int)uVar1) {
        uVar5 = uVar1;
      }
      uVar6 = (uVar5 & 0xfffffffc) + 4;
      if (uVar1 == (uVar5 & 0xfffffffc)) {
        uVar6 = uVar1;
      }
      uVar3 = uVar3 + (long)(&peVar2->bytes_per_element)[lVar4] * (long)(int)uVar7 *
                      (long)(int)uVar6;
      lVar4 = lVar4 + 0x30;
    } while ((long)decode->channel_count * 0x30 != lVar4);
  }
  if (uncompressed_size < uVar3) {
    uncompressed_size = uVar3;
  }
  return uncompressed_size;
}

Assistant:

static uint64_t
compute_scratch_buffer_size (
    exr_decode_pipeline_t* decode, uint64_t uncompressed_size)
{
    const exr_coding_channel_info_t* curc;
    int                              nx, ny;
    uint64_t                         ret  = uncompressed_size;
    uint64_t                         comp = 0;

    for (int c = 0; c < decode->channel_count; ++c)
    {
        curc = decode->channels + c;

        nx = curc->width;
        ny = curc->height;

        if (nx % 4) nx += 4 - nx % 4;
        if (ny % 4) ny += 4 - ny % 4;

        comp += (uint64_t) (ny) * (uint64_t) (nx) *
                (uint64_t) (curc->bytes_per_element);
    }
    if (comp > ret) ret = comp;
    return ret;
}